

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFDocument.cpp
# Opt level: O1

bool iDynTree::addSensorFramesAsAdditionalFramesToModel(Model *model)

{
  char cVar1;
  SensorType *pSVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  Transform *pTVar8;
  long *plVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  string err;
  string err_1;
  string linkToWhichTheSensorIsAttachedName;
  byte local_240;
  uint local_23c;
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  ulong local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [10];
  Transform local_f0 [96];
  undefined1 local_90 [96];
  
  local_23c = 0;
  local_240 = 1;
  uVar11 = 0;
  uVar10 = 0xffffffff;
  do {
    if (uVar10 < 4) {
      local_1d8 = uVar11;
      pSVar2 = (SensorType *)iDynTree::Model::sensors();
      lVar3 = iDynTree::SensorsList::getNrOfSensors(pSVar2);
      bVar12 = lVar3 != 0;
      if (bVar12) {
        uVar11 = 0;
        do {
          pSVar2 = (SensorType *)iDynTree::Model::sensors();
          lVar3 = iDynTree::SensorsList::getSensor(pSVar2,(long)&local_23c);
          if (lVar3 == 0) {
            plVar4 = (long *)0x0;
          }
          else {
            plVar4 = (long *)__dynamic_cast(lVar3,&Sensor::typeinfo,&LinkSensor::typeinfo,0);
          }
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 0x50))(plVar4);
            iDynTree::Model::getLinkName_abi_cxx11_((long)local_150);
            (**(code **)(*plVar4 + 0x10))(local_170,plVar4);
            cVar1 = iDynTree::Model::isFrameNameUsed(model,local_170);
            if (local_170[0] != local_160) {
              operator_delete(local_170[0],local_160[0] + 1);
            }
            if (cVar1 == '\0') {
              (**(code **)(*plVar4 + 0x10))(&local_238,plVar4);
              (**(code **)(*plVar4 + 0x58))(local_90,plVar4);
              cVar1 = iDynTree::Model::addAdditionalFrameToLink(model,local_150,&local_238);
              if (local_238 != &local_228) {
                operator_delete(local_238,local_228 + 1);
              }
              if (cVar1 == '\0') {
                (**(code **)(*plVar4 + 0x10))(&local_1f8);
                plVar5 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_1f8,0,(char *)0x0,0x1379e8);
                local_218 = &local_208;
                plVar9 = plVar5 + 2;
                if ((long *)*plVar5 == plVar9) {
                  local_208 = *plVar9;
                  lStack_200 = plVar5[3];
                }
                else {
                  local_208 = *plVar9;
                  local_218 = (long *)*plVar5;
                }
                local_210 = plVar5[1];
                *plVar5 = (long)plVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_218);
                local_238 = &local_228;
                plVar9 = plVar5 + 2;
                if ((long *)*plVar5 == plVar9) {
                  local_228 = *plVar9;
                  lStack_220 = plVar5[3];
                }
                else {
                  local_228 = *plVar9;
                  local_238 = (long *)*plVar5;
                }
                local_230 = plVar5[1];
                *plVar5 = (long)plVar9;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                if (local_218 != &local_208) {
                  operator_delete(local_218,local_208 + 1);
                }
                if (local_1f8 != &local_1e8) {
                  operator_delete(local_1f8,local_1e8 + 1);
                }
                iDynTree::reportError
                          ("","addSensorFramesAsAdditionalFramesToModel",(char *)local_238);
                if (local_238 != &local_228) {
                  operator_delete(local_238,local_228 + 1);
                }
                local_240 = 0;
              }
            }
            if (local_150[0] != local_140) {
              operator_delete(local_150[0],local_140[0] + 1);
            }
          }
          if (plVar4 == (long *)0x0) break;
          uVar11 = uVar11 + 1;
          pSVar2 = (SensorType *)iDynTree::Model::sensors();
          uVar6 = iDynTree::SensorsList::getNrOfSensors(pSVar2);
          bVar12 = uVar11 < uVar6;
        } while (bVar12);
      }
      uVar11 = local_1d8;
      if (bVar12) break;
    }
    if (local_23c == 0) {
      pSVar2 = (SensorType *)iDynTree::Model::sensors();
      uVar11 = iDynTree::SensorsList::getNrOfSensors(pSVar2);
      if (uVar11 != 0) {
        uVar6 = 0;
        do {
          pSVar2 = (SensorType *)iDynTree::Model::sensors();
          uVar7 = iDynTree::SensorsList::getSensor(pSVar2,(long)&local_23c);
          plVar4 = (long *)__dynamic_cast(uVar7,&Sensor::typeinfo,
                                          &SixAxisForceTorqueSensor::typeinfo,0);
          iDynTree::SixAxisForceTorqueSensor::getSecondLinkName_abi_cxx11_();
          (**(code **)(*plVar4 + 0x10))(local_190,plVar4);
          cVar1 = iDynTree::Model::isFrameNameUsed(model,local_190);
          if (local_190[0] != local_180) {
            operator_delete(local_190[0],local_180[0] + 1);
          }
          if (cVar1 == '\0') {
            iDynTree::Transform::Transform((Transform *)local_150);
            pTVar8 = (Transform *)iDynTree::SixAxisForceTorqueSensor::getSecondLinkIndex();
            cVar1 = iDynTree::SixAxisForceTorqueSensor::getLinkSensorTransform((long)plVar4,pTVar8);
            if (cVar1 == '\0') {
              cVar1 = '\0';
            }
            else {
              (**(code **)(*plVar4 + 0x10))(local_1d0,plVar4);
              iDynTree::Transform::Transform(local_f0,(Transform *)local_150);
              cVar1 = iDynTree::Model::addAdditionalFrameToLink(model,&local_238,local_1d0);
              if (local_1d0[0] != local_1c0) {
                operator_delete(local_1d0[0],local_1c0[0] + 1);
              }
            }
            if (cVar1 == '\0') {
              (**(code **)(*plVar4 + 0x10))(local_1b0);
              plVar4 = (long *)std::__cxx11::string::replace
                                         ((ulong)local_1b0,0,(char *)0x0,0x1379e8);
              local_1f8 = &local_1e8;
              plVar5 = plVar4 + 2;
              if ((long *)*plVar4 == plVar5) {
                local_1e8 = *plVar5;
                lStack_1e0 = plVar4[3];
              }
              else {
                local_1e8 = *plVar5;
                local_1f8 = (long *)*plVar4;
              }
              local_1f0 = plVar4[1];
              *plVar4 = (long)plVar5;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_218 = &local_208;
              plVar5 = plVar4 + 2;
              if ((long *)*plVar4 == plVar5) {
                local_208 = *plVar5;
                lStack_200 = plVar4[3];
              }
              else {
                local_208 = *plVar5;
                local_218 = (long *)*plVar4;
              }
              local_210 = plVar4[1];
              *plVar4 = (long)plVar5;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              if (local_1f8 != &local_1e8) {
                operator_delete(local_1f8,local_1e8 + 1);
              }
              if (local_1b0[0] != local_1a0) {
                operator_delete(local_1b0[0],local_1a0[0] + 1);
              }
              iDynTree::reportError("","addSensorFramesAsAdditionalFramesToModel",(char *)local_218)
              ;
              if (local_218 != &local_208) {
                operator_delete(local_218,local_208 + 1);
              }
              local_240 = 0;
            }
          }
          if (local_238 != &local_228) {
            operator_delete(local_238,local_228 + 1);
          }
          uVar6 = uVar6 + 1;
          pSVar2 = (SensorType *)iDynTree::Model::sensors();
          uVar11 = iDynTree::SensorsList::getNrOfSensors(pSVar2);
        } while (uVar6 < uVar11);
      }
    }
    uVar11 = CONCAT71((int7)(uVar11 >> 8),3 < (int)local_23c);
    bVar12 = (int)local_23c < 4;
    uVar10 = local_23c;
    local_23c = local_23c + 1;
  } while (bVar12);
  return (bool)((byte)uVar11 & local_240);
}

Assistant:

bool addSensorFramesAsAdditionalFramesToModel(Model& model)
    {
        bool ret = true;

        // First, we cycle on all the sensor that are attached to a link, because their frame is easy to add
        // TODO : not super happy about this cycle, but is doing is work well
        for (SensorType type = SIX_AXIS_FORCE_TORQUE; type < NR_OF_SENSOR_TYPES; type = (SensorType)(type + 1))
        {
            // TODO : link sensor are extremly widespared and they have all approximatly the same API,
            //        so we need a better way to iterate over them
            if (isLinkSensor(type))
            {
                for (size_t sensIdx = 0; sensIdx < model.sensors().getNrOfSensors(type); ++sensIdx)
                {
                    LinkSensor * linkSensor = dynamic_cast<LinkSensor*>(model.sensors().getSensor(type,sensIdx));
                    if (!linkSensor) {
                        //TODO: error
                        return false;
                    }

                    LinkIndex linkToWhichTheSensorIsAttached = linkSensor->getParentLinkIndex();
                    std::string linkToWhichTheSensorIsAttachedName = model.getLinkName(linkToWhichTheSensorIsAttached);

                    if (!model.isFrameNameUsed(linkSensor->getName()))
                    {
                        // std::cerr << "Adding sensor " << linkSensor->getName() << " to link " << linkToWhichTheSensorIsAttachedName << " as additional frame"<< std::endl;
                        bool ok = model.addAdditionalFrameToLink(linkToWhichTheSensorIsAttachedName,linkSensor->getName(),linkSensor->getLinkSensorTransform());

                        if (!ok)
                        {
                            std::string err = "addSensorFramesAsAdditionalFrames is specified as an option, but it is impossible to add the frame of sensor " + linkSensor->getName() + " for unknown reasons";
                            reportError("", "addSensorFramesAsAdditionalFramesToModel", err.c_str());
                            ret = false;
                        }
                    }
                }
            }

            // Explictly address the case of F/T sensors
            if (type == SIX_AXIS_FORCE_TORQUE)
            {
                // We add the sensor frame as an additional frame of the **child** link
                // (as tipically for URDF sensors the child link frame is coincident with the F/T sensor frame
                for (size_t sensIdx = 0; sensIdx < model.sensors().getNrOfSensors(type); ++sensIdx)
                {
                    SixAxisForceTorqueSensor * ftSensor = dynamic_cast<SixAxisForceTorqueSensor*>(model.sensors().getSensor(type,sensIdx));

                    std::string linkToWhichTheSensorIsAttachedName = ftSensor->getSecondLinkName();

                    if (!model.isFrameNameUsed(ftSensor->getName()))
                    {
                        Transform link_H_sensor;
                        bool ok = ftSensor->getLinkSensorTransform(ftSensor->getSecondLinkIndex(),link_H_sensor);
                        ok = ok && model.addAdditionalFrameToLink(linkToWhichTheSensorIsAttachedName,ftSensor->getName(),link_H_sensor);

                        if (!ok)
                        {
                            std::string err = "addSensorFramesAsAdditionalFrames is specified as an option, but it is impossible to add the frame of sensor " + ftSensor->getName() + " for unknown reasons";
                            reportError("", "addSensorFramesAsAdditionalFramesToModel", err.c_str());
                            ret = false;
                        }
                    }
                }
            }
        }

        return ret;
    }